

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Electrostatic.cpp
# Opt level: O2

void __thiscall OpenMD::Electrostatic::Electrostatic(Electrostatic *this)

{
  _Rb_tree_header *p_Var1;
  FluctuatingChargeForces *this_00;
  allocator<char> local_59 [41];
  
  (this->super_ElectrostaticInteraction).super_NonBondedInteraction._vptr_NonBondedInteraction =
       (_func_int **)&PTR__Electrostatic_002c7cd0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->name_,"Electrostatic",local_59);
  (this->Etypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Etypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  this->initialized_ = false;
  this->haveCutoffRadius_ = false;
  this->haveDampingAlpha_ = false;
  this->haveDielectric_ = false;
  p_Var1 = &(this->Etypes)._M_t._M_impl.super__Rb_tree_header;
  this->haveElectroSplines_ = false;
  (this->Etypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Etypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->FQtypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->FQtypes)._M_t._M_impl.super__Rb_tree_header;
  (this->FQtypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Etypes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->Etids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->Etids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->Etids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->FQtypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->FQtypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->simTypes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->simTypes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->simTypes_)._M_t._M_impl.super__Rb_tree_header;
  (this->FQtypes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->FQtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->FQtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->FQtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->ElectrostaticMap).
  super__Vector_base<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ElectrostaticMap).
  super__Vector_base<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ElectrostaticMap).
  super__Vector_base<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Jij).
  super__Vector_base<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>,_std::allocator<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Jij).
  super__Vector_base<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>,_std::allocator<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Jij).
  super__Vector_base<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>,_std::allocator<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->info_ = (SimInfo *)0x0;
  this->forceField_ = (ForceField *)0x0;
  (this->simTypes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->simTypes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->simTypes_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->summationMap_)._M_t._M_impl.super__Rb_tree_header;
  (this->summationMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->summationMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->summationMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->summationMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->summationMap_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->screeningMap_)._M_t._M_impl.super__Rb_tree_header;
  (this->screeningMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->screeningMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->screeningMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->screeningMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->screeningMap_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  memset(&this->v01s,0,0x90);
  ElectrostaticAtomData::ElectrostaticAtomData(&this->data1);
  ElectrostaticAtomData::ElectrostaticAtomData(&this->data2);
  Vector<double,_3U>::Vector(&(this->D_a).super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&(this->D_b).super_Vector<double,_3U>);
  SquareMatrix<double,_3>::SquareMatrix(&(this->Q_a).super_SquareMatrix<double,_3>);
  SquareMatrix<double,_3>::SquareMatrix(&(this->Q_b).super_SquareMatrix<double,_3>);
  Vector<double,_3U>::Vector(&(this->rxDa).super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&(this->rxDb).super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&(this->Qar).super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&(this->Qbr).super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&(this->rQa).super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&(this->rQb).super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&(this->rxQar).super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&(this->rxQbr).super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&(this->DaxDb).super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&(this->DadQb).super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&(this->DbdQa).super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&(this->DaxQbr).super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&(this->DbxQar).super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&(this->rQaQb).super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&(this->QaQbr).super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&(this->QaxQb).super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&(this->rQaxQbr).super_Vector<double,_3U>);
  SquareMatrix<double,_3>::SquareMatrix(&(this->QaQb).super_SquareMatrix<double,_3>);
  Vector<double,_3U>::Vector(&(this->F).super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&(this->Ta).super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&(this->Tb).super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&(this->Ea).super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&(this->Eb).super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&(this->indirect_F).super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&(this->indirect_Ta).super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&(this->indirect_Tb).super_Vector<double,_3U>);
  (this->J).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->J).super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Vector<double,_3U>::Vector(&(this->rhat).super_Vector<double,_3U>);
  this_00 = (FluctuatingChargeForces *)operator_new(0x100);
  FluctuatingChargeForces::FluctuatingChargeForces(this_00,this->info_);
  this->flucQ_ = this_00;
  return;
}

Assistant:

Electrostatic::Electrostatic() :
      name_("Electrostatic"), initialized_(false), haveCutoffRadius_(false),
      haveDampingAlpha_(false), haveDielectric_(false),
      haveElectroSplines_(false), info_(NULL), forceField_(NULL)

  {
    flucQ_ = new FluctuatingChargeForces(info_);
  }